

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall HighsDomain::backtrackToGlobal(HighsDomain *this)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  HighsBoundType HVar4;
  Reason reason;
  pointer pHVar5;
  pointer ppVar6;
  pointer pRVar7;
  pointer piVar8;
  bool bVar9;
  byte bVar10;
  vector<int,_std::allocator<int>_> *pvVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  HighsDomainChange local_40;
  int iVar18;
  
  uVar15 = (ulong)((long)(this->domchgstack_).
                         super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->domchgstack_).
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_start) >> 4;
  bVar3 = this->infeasible_;
  reason = this->infeasible_reason;
  uVar13 = (uint)uVar15;
  bVar10 = bVar3;
  if ((bVar3 == true) && (bVar10 = 1, this->infeasible_pos == uVar13)) {
    this->infeasible_ = false;
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
    bVar10 = 0;
  }
  if (0 < (int)uVar13) {
    lVar12 = (ulong)(uVar13 & 0x7fffffff) * 0x10 + -8;
    uVar16 = (ulong)(uVar13 & 0x7fffffff);
    do {
      pHVar5 = (this->domchgstack_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start;
      ppVar6 = (this->prevboundval_).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar2 = *(double *)((long)ppVar6 + lVar12 + -8);
      HVar4 = *(HighsBoundType *)((long)&pHVar5->boundval + lVar12 + 4);
      pvVar11 = &this->colUpperPos_;
      if (HVar4 == kLower) {
        pvVar11 = &this->colLowerPos_;
      }
      (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[*(int *)((long)&pHVar5->boundval + lVar12)] = *(int *)((long)&ppVar6->first + lVar12)
      ;
      pdVar1 = (double *)((long)pHVar5 + lVar12 + -8);
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        local_40.column = *(HighsInt *)((long)&pHVar5->boundval + lVar12);
        local_40.boundval = dVar2;
        local_40.boundtype = HVar4;
        doChangeBound(this,&local_40);
        bVar10 = this->infeasible_;
      }
      uVar15 = uVar16 - 1;
      if (((bVar10 & 1) != 0) && (uVar15 == (uint)this->infeasible_pos)) {
        this->infeasible_ = false;
        (this->infeasible_reason).type = -2;
        (this->infeasible_reason).index = 0;
        bVar10 = 0;
      }
      lVar12 = lVar12 + -0x10;
      bVar9 = 1 < uVar16;
      uVar16 = uVar15;
    } while (bVar9);
  }
  if (bVar3 != false) {
    markPropagateCut(this,reason);
    (this->infeasible_reason).type = -2;
    (this->infeasible_reason).index = 0;
    this->infeasible_ = false;
  }
  iVar14 = (int)uVar15;
  iVar18 = (int)((ulong)((long)(this->domchgreason_).
                               super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->domchgreason_).
                              super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  iVar17 = iVar18 - iVar14;
  if (iVar17 != 0 && iVar14 <= iVar18) {
    lVar12 = (long)iVar14;
    do {
      markPropagateCut(this,(this->domchgreason_).
                            super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar12]);
      lVar12 = lVar12 + 1;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
  }
  pHVar5 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar5) {
    (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar5;
  }
  ppVar6 = (this->prevboundval_).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar6) {
    (this->prevboundval_).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar6;
  }
  pRVar7 = (this->domchgreason_).
           super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar7) {
    (this->domchgreason_).
    super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar7;
  }
  piVar8 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar8) {
    (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar8;
  }
  return;
}

Assistant:

void HighsDomain::backtrackToGlobal() {
  HighsInt k = HighsInt(domchgstack_.size()) - 1;
  bool old_infeasible = infeasible_;
  Reason old_reason = infeasible_reason;

  if (infeasible_ && infeasible_pos == HighsInt(domchgstack_.size())) {
    assert(old_infeasible);
    assert(k == HighsInt(domchgstack_.size()) - 1);
    infeasible_ = false;
    infeasible_reason = Reason::unspecified();
  }

  while (k >= 0) {
    double prevbound = prevboundval_[k].first;
    HighsInt prevpos = prevboundval_[k].second;
    assert(prevpos < k);

    mipsolver->mipdata_->debugSolution.boundChangeRemoved(*this,
                                                          domchgstack_[k]);

    if (domchgstack_[k].boundtype == HighsBoundType::kLower) {
      assert(colLowerPos_[domchgstack_[k].column] == k);
      colLowerPos_[domchgstack_[k].column] = prevpos;
    } else {
      assert(colUpperPos_[domchgstack_[k].column] == k);
      colUpperPos_[domchgstack_[k].column] = prevpos;
    }

    if (prevbound != domchgstack_[k].boundval) {
      // change back to global bound
      doChangeBound(
          {prevbound, domchgstack_[k].column, domchgstack_[k].boundtype});
    }

    if (infeasible_ && infeasible_pos == k) {
      assert(old_infeasible);
      assert(k == HighsInt(domchgstack_.size()) - 1);
      infeasible_ = false;
      infeasible_reason = Reason::unspecified();
    }

    --k;
  }

  if (old_infeasible) {
    markPropagateCut(old_reason);
    infeasible_reason = Reason::unspecified();
    infeasible_ = false;
  }

  HighsInt numreason = domchgreason_.size();
  for (HighsInt i = k + 1; i < numreason; ++i)
    markPropagateCut(domchgreason_[i]);

  domchgstack_.clear();
  prevboundval_.clear();
  domchgreason_.clear();
  branchPos_.clear();
}